

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  VariableID id;
  uint *puVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  SPIRFunction *pSVar4;
  bool bVar5;
  uint id_00;
  SPIRType *pSVar6;
  SPIRVariable *pSVar7;
  MSLConstexprSampler *pMVar8;
  char (*pacVar9) [16];
  uint32_t uVar10;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long lVar11;
  Parameter *arg;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_d0;
  SPIRFunction *local_b0;
  string decl;
  undefined1 local_80 [8];
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Parameter *local_60;
  char *sampler_address_space;
  string local_50;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  this_00 = &(this->super_CompilerGLSL).local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&(this->super_CompilerGLSL).resource_names._M_h);
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  bVar12 = (func->super_IVariant).self.id ==
           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  (this->super_CompilerGLSL).processing_entry_point = bVar12;
  if (!bVar12) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  local_b0 = func;
  pSVar6 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(func->super_IVariant).field_0xc);
  if (((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->msl_options).force_native_arrays != true)) {
    func_type_decl_abi_cxx11_(&local_d0,this,pSVar6);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    ::std::__cxx11::string::append((char *)&decl);
  }
  ::std::__cxx11::string::append((char *)&decl);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_d0,this,(ulong)(local_b0->super_IVariant).self.id,1);
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::append((char *)&decl);
  if (((pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     ((this->msl_options).force_native_arrays == true)) {
    ::std::__cxx11::string::append((char *)&decl);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_d0,this,pSVar6,0);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::append((char *)&decl);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_d0,this,pSVar6,0);
    ::std::__cxx11::string::append((string *)&decl);
    pSVar4 = local_b0;
    ::std::__cxx11::string::~string((string *)&local_d0);
    if ((pSVar4->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size != 0)
    {
      ::std::__cxx11::string::append((char *)&decl);
    }
  }
  if ((this->super_CompilerGLSL).processing_entry_point == true) {
    if ((this->msl_options).argument_buffers == true) {
      entry_point_args_argument_buffer_abi_cxx11_
                (&local_d0,this,
                 (local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::append((string *)&decl);
    }
    else {
      entry_point_args_classic_abi_cxx11_
                (&local_d0,this,
                 (local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::append((string *)&decl);
    }
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__detail::
    _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
              ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )(this->super_CompilerGLSL).resource_names._M_h._M_before_begin._M_nxt,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )0x0);
    puVar1 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr;
    sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    for (lVar11 = 0; sVar2 << 2 != lVar11; lVar11 = lVar11 + 4) {
      pSVar7 = Compiler::get<spirv_cross::SPIRVariable>
                         ((Compiler *)this,*(uint32_t *)((long)puVar1 + lVar11));
      id_00 = (pSVar7->initializer).id;
      if (id_00 == 0) {
        id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        (pSVar7->initializer).id = id_00;
      }
      if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr[id_00].type & ~TypeExpression) == TypeNone) {
        local_d0._M_dataplus._M_p._0_1_ = 1;
        in_R8 = &local_d0;
        Compiler::
        set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  ((Compiler *)this,id_00,(char (*) [3])0x33d9c8,
                   (TypedID<(spirv_cross::Types)1> *)&(pSVar7->super_IVariant).field_0xc,
                   (bool *)in_R8);
      }
    }
    pTVar3 = (local_b0->local_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    sVar2 = (local_b0->local_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    for (lVar11 = 0; sVar2 << 2 != lVar11; lVar11 = lVar11 + 4) {
      pSVar7 = Compiler::get<spirv_cross::SPIRVariable>
                         ((Compiler *)this,*(uint32_t *)((long)&pTVar3->id + lVar11));
      if (pSVar7->storage == StorageClassTaskPayloadWorkgroupEXT) {
        CompilerGLSL::add_local_variable_name
                  (&this->super_CompilerGLSL,*(uint32_t *)((long)&pTVar3->id + lVar11));
        local_78 = 0;
        local_80._4_4_ = *(uint32_t *)((long)&pTVar3->id + lVar11);
        local_80._0_4_ = *(undefined4 *)&(pSVar7->super_IVariant).field_0xc;
        local_70._M_local_buf[0] = true;
        argument_decl_abi_cxx11_(&local_50,this,(Parameter *)local_80);
        join<char_const(&)[3],std::__cxx11::string,char_const(&)[13]>
                  (&local_d0,(spirv_cross *)0x341bb2,(char (*) [3])&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[payload]]",(char (*) [13])in_R8);
        ::std::__cxx11::string::append((string *)&decl);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  arg = (local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  local_60 = arg + (local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                   buffer_size;
  do {
    if (arg == local_60) {
      ::std::__cxx11::string::append((char *)&decl);
      CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&decl);
      ::std::__cxx11::string::~string((string *)&decl);
      return;
    }
    id.id = (arg->id).id;
    pSVar7 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id.id);
    if (pSVar7 != (SPIRVariable *)0x0) {
      if ((arg->alias_global_variable == true) && (uVar10 = (pSVar7->basevariable).id, uVar10 != 0))
      {
        id.id = uVar10;
      }
      pSVar7->parameter = arg;
    }
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,id.id);
    argument_decl_abi_cxx11_(&local_d0,this,arg);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&local_d0);
    bVar12 = Compiler::has_extended_decoration
                       ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(arg->type).id);
    if (pSVar6->basetype == SampledImage && !bVar12) {
      pMVar8 = find_constexpr_sampler(this,id.id);
      uVar10 = 1;
      if ((pMVar8 != (MSLConstexprSampler *)0x0) && (pMVar8->ycbcr_conversion_enable == true)) {
        uVar10 = pMVar8->planes;
      }
      for (local_80._0_4_ = 1; (uint)local_80._0_4_ < uVar10; local_80._0_4_ = local_80._0_4_ + 1) {
        argument_decl_abi_cxx11_(&local_50,this,arg);
        in_R8 = (string *)local_80;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  (&local_d0,(spirv_cross *)0x341bb2,(char (*) [3])&local_50,
                   &this->plane_name_suffix,in_R8,(uint *)in_R9);
        ::std::__cxx11::string::append((string *)&decl);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      if ((pSVar6->image).dim != Buffer) {
        if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) {
LAB_0020e5ba:
          sampler_type_abi_cxx11_(&local_50,this,pSVar6,(arg->id).id,false);
          in_R8 = (string *)local_80;
          to_sampler_expression_abi_cxx11_(in_R8,this,id.id);
          join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                    (&local_d0,(spirv_cross *)0x341bb2,(char (*) [3])&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3175f1,
                     (char (*) [2])in_R8,in_R9);
          ::std::__cxx11::string::append((string *)&decl);
        }
        else {
          if (pSVar7 == (SPIRVariable *)0x0) {
            bVar5 = Compiler::is_runtime_size_array(pSVar6);
          }
          else {
            bVar5 = is_var_runtime_size_array(this,pSVar7);
          }
          if (bVar5 != false) goto LAB_0020e5ba;
          sampler_address_space =
               descriptor_address_space(this,id.id,StorageClassUniformConstant,"thread const");
          sampler_type_abi_cxx11_(&local_50,this,pSVar6,id.id,false);
          to_sampler_expression_abi_cxx11_((string *)local_80,this,id.id);
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33f929;
          in_R8 = &local_50;
          join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                    (&local_d0,(spirv_cross *)0x341bb2,(char (*) [3])&sampler_address_space,
                     (char **)0x3175f1,(char (*) [2])&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33f929,
                     (char (*) [3])local_80,in_stack_ffffffffffffff10);
          ::std::__cxx11::string::append((string *)&decl);
        }
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)local_80);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if ((((this->msl_options).swizzle_texture_samples == true) && (this->has_sampled_images == true)
        ) && (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,pSVar6), !bVar12 && bVar5)) {
      sVar2 = (pSVar6->array).super_VectorView<unsigned_int>.buffer_size;
      to_swizzle_expression_abi_cxx11_(&local_50,this,id.id);
      pacVar9 = (char (*) [16])0x344f61;
      if (sVar2 == 0) {
        pacVar9 = (char (*) [16])0x33f929;
      }
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                (&local_d0,(spirv_cross *)", constant uint",pacVar9,(char (*) [3])&local_50,in_R8);
      ::std::__cxx11::string::append((string *)&decl);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    bVar12 = buffer_requires_array_length(this,id);
    if (bVar12) {
      sVar2 = (pSVar6->array).super_VectorView<unsigned_int>.buffer_size;
      to_buffer_size_expression_abi_cxx11_(&local_50,this,id.id);
      pacVar9 = (char (*) [16])0x344f61;
      if (sVar2 == 0) {
        pacVar9 = (char (*) [16])0x33f929;
      }
      join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                (&local_d0,(spirv_cross *)", constant uint",pacVar9,(char (*) [3])&local_50,in_R8);
      ::std::__cxx11::string::append((string *)&decl);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    if (arg != (local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
               ((local_b0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                buffer_size - 1)) {
      ::std::__cxx11::string::append((char *)&decl);
    }
    arg = arg + 1;
  } while( true );
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type, 0);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}

		// add `taskPayloadSharedEXT` variable to entry-point arguments
		for (auto &v : func.local_variables)
		{
			auto &var = get<SPIRVariable>(v);
			if (var.storage != StorageClassTaskPayloadWorkgroupEXT)
				continue;

			add_local_variable_name(v);
			SPIRFunction::Parameter arg = {};
			arg.id = v;
			arg.type = var.basetype;
			arg.alias_global_variable = true;
			decl += join(", ", argument_decl(arg), " [[payload]]");
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty() || (var ? is_var_runtime_size_array(*var) : is_runtime_size_array(arg_type)))
				{
					decl += join(", ", sampler_type(arg_type, arg.id, false), " ", to_sampler_expression(name_id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, name_id, false), "& ",
					             to_sampler_expression(name_id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(name_id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}